

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::UntypedMapBase::TransferTree
          (UntypedMapBase *this,Tree *tree,GetKey get_key)

{
  NodeBase *pNVar1;
  bool bVar2;
  map_index_t b;
  uint uVar3;
  NodeBase *node;
  VariantKey key;
  
  node = DestroyTree(this,tree);
  do {
    pNVar1 = node->next;
    key = (*get_key)(node);
    b = VariantBucketNumber(this,key);
    if (this->table_[b] == 0) {
      InsertUniqueInList(this,b,node);
      uVar3 = this->index_of_first_non_null_;
      if (b < this->index_of_first_non_null_) {
        uVar3 = b;
      }
      this->index_of_first_non_null_ = uVar3;
    }
    else {
      if ((this->table_[b] & 1) == 0) {
        bVar2 = TableEntryIsTooLong(this,b);
        if (!bVar2) {
          InsertUniqueInList(this,b,node);
          goto LAB_0016d9d2;
        }
      }
      InsertUniqueInTree(this,b,get_key,node);
    }
LAB_0016d9d2:
    node = pNVar1;
    if (pNVar1 == (NodeBase *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

void UntypedMapBase::TransferTree(Tree* tree, GetKey get_key) {
  NodeBase* node = DestroyTree(tree);
  do {
    NodeBase* next = node->next;

    map_index_t b = VariantBucketNumber(get_key(node));
    // This is similar to InsertUnique, but with erasure.
    if (TableEntryIsEmpty(b)) {
      InsertUniqueInList(b, node);
      index_of_first_non_null_ = (std::min)(index_of_first_non_null_, b);
    } else if (TableEntryIsNonEmptyList(b) && !TableEntryIsTooLong(b)) {
      InsertUniqueInList(b, node);
    } else {
      InsertUniqueInTree(b, get_key, node);
    }

    node = next;
  } while (node != nullptr);
}